

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pingpong.c
# Opt level: O1

CURLcode Curl_pp_readresp(Curl_easy *data,curl_socket_t sockfd,pingpong *pp,int *code,size_t *size)

{
  curl_off_t *pcVar1;
  bool bVar2;
  bool bVar3;
  bool bVar4;
  _Bool _Var5;
  CURLcode CVar6;
  uint *puVar7;
  ulong uVar8;
  char *pcVar9;
  ulong uVar10;
  size_t sVar11;
  size_t size_00;
  long lVar12;
  size_t __n;
  char *buf;
  ssize_t gotbytes;
  CURLcode local_74;
  size_t local_70;
  char *local_68;
  char *local_60;
  curl_socket_t local_54;
  char *local_50;
  size_t *local_48;
  connectdata *local_40;
  int *local_38;
  
  local_40 = data->conn;
  local_60 = (data->state).buffer;
  *code = 0;
  *size = 0;
  uVar8 = pp->nread_resp;
  uVar10 = (ulong)(data->set).buffer_size;
  CVar6 = CURLE_OK;
  if (uVar8 < uVar10) {
    pcVar9 = local_60 + 1;
    buf = local_60 + pp->nread_resp;
    size_00 = (long)buf - (long)pp->linestart_resp;
    bVar4 = true;
    CVar6 = CURLE_OK;
    local_68 = pcVar9;
    local_54 = sockfd;
    local_48 = size;
    local_38 = code;
    do {
      if (pp->cache == (char *)0x0) {
        CVar6 = Curl_read(data,local_54,buf,uVar10 - uVar8,(ssize_t *)&local_70);
        if (CVar6 != CURLE_OK) {
          if (CVar6 == CURLE_AGAIN) {
            return CURLE_OK;
          }
          bVar4 = false;
        }
      }
      else {
        if (pcVar9 + uVar10 < buf + pp->cache_size) {
          Curl_failf(data,"cached response data too big to handle");
          return CURLE_WEIRD_SERVER_REPLY;
        }
        memcpy(buf,pp->cache,pp->cache_size);
        local_70 = pp->cache_size;
        (*Curl_cfree)(pp->cache);
        pp->cache = (char *)0x0;
        pp->cache_size = 0;
      }
      if (bVar4) {
        if ((long)local_70 < 1) {
          puVar7 = (uint *)__errno_location();
          bVar4 = false;
          Curl_failf(data,"response reading failed (errno: %d)",(ulong)*puVar7);
          CVar6 = CURLE_RECV_ERROR;
        }
        else {
          pcVar1 = &(data->req).headerbytecount;
          *pcVar1 = *pcVar1 + local_70;
          pp->nread_resp = pp->nread_resp + local_70;
          if ((long)local_70 < 1) {
            lVar12 = 0;
          }
          else {
            lVar12 = 0;
            do {
              size_00 = size_00 + 1;
              if (buf[lVar12] == '\n') {
                Curl_debug(data,CURLINFO_HEADER_IN,pp->linestart_resp,size_00);
                CVar6 = Curl_client_write(data,2,pp->linestart_resp,size_00);
                if (CVar6 != CURLE_OK) {
                  buf = buf + lVar12;
                  bVar3 = false;
                  local_74 = CVar6;
                  goto LAB_00140985;
                }
                _Var5 = (*pp->endofresp)(data,local_40,pp->linestart_resp,size_00,local_38);
                if (_Var5) {
                  local_50 = buf + lVar12;
                  __n = (long)local_50 - (long)pp->linestart_resp;
                  memmove(local_60,pp->linestart_resp,__n);
                  local_60[__n] = '\0';
                  pp->linestart_resp = buf + lVar12 + 1;
                  lVar12 = lVar12 + 1;
                  *local_48 = pp->nread_resp;
                  pp->nread_resp = 0;
                  bVar4 = false;
                  CVar6 = CURLE_OK;
                  buf = local_50;
                  goto LAB_001408d7;
                }
                pp->linestart_resp = buf + lVar12 + 1;
                size_00 = 0;
                CVar6 = CURLE_OK;
              }
              lVar12 = lVar12 + 1;
            } while (lVar12 < (long)local_70);
            buf = buf + lVar12;
          }
LAB_001408d7:
          if (bVar4) {
            if ((size_00 == local_70) &&
               ((long)(ulong)((data->set).buffer_size >> 1) < (long)local_70)) {
              Curl_infof(data,"Excessive server response line length received, %zd bytes. Stripping"
                        );
              bVar2 = true;
              sVar11 = 0x28;
            }
            else {
              uVar8 = (ulong)((data->set).buffer_size >> 1);
              bVar2 = uVar8 < pp->nread_resp;
              sVar11 = 0;
              if (uVar8 < pp->nread_resp) {
                sVar11 = size_00;
              }
            }
          }
          else {
            sVar11 = local_70 - lVar12;
            bVar2 = true;
          }
          if (sVar11 == 0) {
LAB_0014095f:
            bVar3 = true;
            if (bVar2) {
              pp->nread_resp = 0;
              pp->linestart_resp = local_60;
              size_00 = 0;
              buf = local_60;
            }
          }
          else {
            pp->cache_size = sVar11;
            pcVar9 = (char *)(*Curl_cmalloc)(sVar11);
            pp->cache = pcVar9;
            if (pcVar9 != (char *)0x0) {
              memcpy(pcVar9,pp->linestart_resp,pp->cache_size);
              goto LAB_0014095f;
            }
            local_74 = CURLE_OUT_OF_MEMORY;
            bVar3 = false;
          }
LAB_00140985:
          pcVar9 = local_68;
          if (!bVar3) {
            return local_74;
          }
        }
      }
      uVar8 = pp->nread_resp;
      uVar10 = (ulong)(data->set).buffer_size;
    } while (((uVar8 < uVar10) && (bVar4)) && (CVar6 == CURLE_OK));
  }
  pp->pending_resp = false;
  return CVar6;
}

Assistant:

CURLcode Curl_pp_readresp(struct Curl_easy *data,
                          curl_socket_t sockfd,
                          struct pingpong *pp,
                          int *code, /* return the server code if done */
                          size_t *size) /* size of the response */
{
  ssize_t perline; /* count bytes per line */
  bool keepon = TRUE;
  ssize_t gotbytes;
  char *ptr;
  struct connectdata *conn = data->conn;
  char * const buf = data->state.buffer;
  CURLcode result = CURLE_OK;

  *code = 0; /* 0 for errors or not done */
  *size = 0;

  ptr = buf + pp->nread_resp;

  /* number of bytes in the current line, so far */
  perline = (ssize_t)(ptr-pp->linestart_resp);

  while((pp->nread_resp < (size_t)data->set.buffer_size) &&
        (keepon && !result)) {

    if(pp->cache) {
      /* we had data in the "cache", copy that instead of doing an actual
       * read
       *
       * pp->cache_size is cast to ssize_t here.  This should be safe, because
       * it would have been populated with something of size int to begin
       * with, even though its datatype may be larger than an int.
       */
      if((ptr + pp->cache_size) > (buf + data->set.buffer_size + 1)) {
        failf(data, "cached response data too big to handle");
        return CURLE_WEIRD_SERVER_REPLY;
      }
      memcpy(ptr, pp->cache, pp->cache_size);
      gotbytes = (ssize_t)pp->cache_size;
      free(pp->cache);    /* free the cache */
      pp->cache = NULL;   /* clear the pointer */
      pp->cache_size = 0; /* zero the size just in case */
    }
    else {
#ifdef HAVE_GSSAPI
      enum protection_level prot = conn->data_prot;
      conn->data_prot = PROT_CLEAR;
#endif
      DEBUGASSERT((ptr + data->set.buffer_size - pp->nread_resp) <=
                  (buf + data->set.buffer_size + 1));
      result = Curl_read(data, sockfd, ptr,
                         data->set.buffer_size - pp->nread_resp,
                         &gotbytes);
#ifdef HAVE_GSSAPI
      DEBUGASSERT(prot  > PROT_NONE && prot < PROT_LAST);
      conn->data_prot = prot;
#endif
      if(result == CURLE_AGAIN)
        return CURLE_OK; /* return */

      if(result)
        /* Set outer result variable to this error. */
        keepon = FALSE;
    }

    if(!keepon)
      ;
    else if(gotbytes <= 0) {
      keepon = FALSE;
      result = CURLE_RECV_ERROR;
      failf(data, "response reading failed (errno: %d)", SOCKERRNO);
    }
    else {
      /* we got a whole chunk of data, which can be anything from one
       * byte to a set of lines and possible just a piece of the last
       * line */
      ssize_t i;
      ssize_t clipamount = 0;
      bool restart = FALSE;

      data->req.headerbytecount += (long)gotbytes;

      pp->nread_resp += gotbytes;
      for(i = 0; i < gotbytes; ptr++, i++) {
        perline++;
        if(*ptr == '\n') {
          /* a newline is CRLF in pp-talk, so the CR is ignored as
             the line isn't really terminated until the LF comes */

          /* output debug output if that is requested */
#ifdef HAVE_GSSAPI
          if(!conn->sec_complete)
#endif
            Curl_debug(data, CURLINFO_HEADER_IN,
                       pp->linestart_resp, (size_t)perline);

          /*
           * We pass all response-lines to the callback function registered
           * for "headers". The response lines can be seen as a kind of
           * headers.
           */
          result = Curl_client_write(data, CLIENTWRITE_HEADER,
                                     pp->linestart_resp, perline);
          if(result)
            return result;

          if(pp->endofresp(data, conn, pp->linestart_resp, perline, code)) {
            /* This is the end of the last line, copy the last line to the
               start of the buffer and null-terminate, for old times sake */
            size_t n = ptr - pp->linestart_resp;
            memmove(buf, pp->linestart_resp, n);
            buf[n] = 0; /* null-terminate */
            keepon = FALSE;
            pp->linestart_resp = ptr + 1; /* advance pointer */
            i++; /* skip this before getting out */

            *size = pp->nread_resp; /* size of the response */
            pp->nread_resp = 0; /* restart */
            break;
          }
          perline = 0; /* line starts over here */
          pp->linestart_resp = ptr + 1;
        }
      }

      if(!keepon && (i != gotbytes)) {
        /* We found the end of the response lines, but we didn't parse the
           full chunk of data we have read from the server. We therefore need
           to store the rest of the data to be checked on the next invoke as
           it may actually contain another end of response already! */
        clipamount = gotbytes - i;
        restart = TRUE;
        DEBUGF(infof(data, "Curl_pp_readresp_ %d bytes of trailing "
                     "server response left",
                     (int)clipamount));
      }
      else if(keepon) {

        if((perline == gotbytes) &&
           (gotbytes > (ssize_t)data->set.buffer_size/2)) {
          /* We got an excessive line without newlines and we need to deal
             with it. We keep the first bytes of the line then we throw
             away the rest. */
          infof(data, "Excessive server response line length received, "
                "%zd bytes. Stripping", gotbytes);
          restart = TRUE;

          /* we keep 40 bytes since all our pingpong protocols are only
             interested in the first piece */
          clipamount = 40;
        }
        else if(pp->nread_resp > (size_t)data->set.buffer_size/2) {
          /* We got a large chunk of data and there's potentially still
             trailing data to take care of, so we put any such part in the
             "cache", clear the buffer to make space and restart. */
          clipamount = perline;
          restart = TRUE;
        }
      }
      else if(i == gotbytes)
        restart = TRUE;

      if(clipamount) {
        pp->cache_size = clipamount;
        pp->cache = malloc(pp->cache_size);
        if(pp->cache)
          memcpy(pp->cache, pp->linestart_resp, pp->cache_size);
        else
          return CURLE_OUT_OF_MEMORY;
      }
      if(restart) {
        /* now reset a few variables to start over nicely from the start of
           the big buffer */
        pp->nread_resp = 0; /* start over from scratch in the buffer */
        ptr = pp->linestart_resp = buf;
        perline = 0;
      }

    } /* there was data */

  } /* while there's buffer left and loop is requested */

  pp->pending_resp = FALSE;

  return result;
}